

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transporter.cpp
# Opt level: O0

bool Transporter::ParseSocketAddress(string *host,int port,sockaddr_storage *addr,string *err)

{
  int iVar1;
  uv_loop_t *loop_00;
  char *pcVar2;
  char *service;
  string local_100;
  int local_dc;
  undefined1 local_d8 [4];
  int res;
  uv_getaddrinfo_t resolver;
  uv_loop_t *loop;
  string *err_local;
  sockaddr_storage *addr_local;
  int port_local;
  string *host_local;
  
  loop_00 = uv_default_loop();
  resolver._152_8_ = loop_00;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::__cxx11::to_string(&local_100,port);
  service = (char *)std::__cxx11::string::c_str();
  iVar1 = uv_getaddrinfo(loop_00,(uv_getaddrinfo_t *)local_d8,(uv_getaddrinfo_cb)0x0,pcVar2,service,
                         (addrinfo *)0x0);
  std::__cxx11::string::~string((string *)&local_100);
  local_dc = iVar1;
  if (iVar1 == 0) {
    memcpy(addr,*(void **)(resolver.service + 0x18),(ulong)*(uint *)(resolver.service + 0x10));
    uv_freeaddrinfo((addrinfo *)resolver.service);
  }
  else {
    std::__cxx11::string::operator=((string *)err,"Invalid host: ");
    pcVar2 = uv_strerror(local_dc);
    std::__cxx11::string::operator+=((string *)err,pcVar2);
  }
  return iVar1 == 0;
}

Assistant:

bool Transporter::ParseSocketAddress(const std::string &host, int port, sockaddr_storage *addr, std::string &err) 
{
	auto const loop = uv_default_loop();
	uv_getaddrinfo_t resolver;
	int res = uv_getaddrinfo(loop, &resolver, nullptr, host.c_str(),
	                         std::to_string(port).c_str(), nullptr);
	if (res != 0) {
		err = "Invalid host: ";
		err += uv_strerror(res);
		return false;
	}
	memcpy(addr, resolver.addrinfo->ai_addr, resolver.addrinfo->ai_addrlen);
	uv_freeaddrinfo(resolver.addrinfo);
	return true;
}